

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::anon_unknown_14::DefinitelyNeedsEscape(uchar ch)

{
  bool bVar1;
  bool local_9;
  uchar ch_local;
  
  if (ch < 0x80) {
    bVar1 = absl::lts_20250127::ascii_isprint(ch);
    if (bVar1) {
      if (((ch == '\"') || (ch == '\'')) || (ch == '\\')) {
        local_9 = true;
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = true;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool DefinitelyNeedsEscape(unsigned char ch) {
  if (ch >= 0x80) {
    return false;  // High byte; no escapes necessary if UTF-8 is valid.
  }

  if (!absl::ascii_isprint(ch)) {
    return true;  // Unprintable characters need escape.
  }

  switch (ch) {
    case '\"':
    case '\'':
    case '\\':
      // These characters need escapes despite being printable.
      return true;
  }

  return false;
}